

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O3

int fits_hdecompress(uchar *input,int smooth,int *a,int *ny,int *nx,int *scale,int *status)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  byte bVar10;
  int *piVar11;
  int iVar12;
  int iVar13;
  int *piVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  char *err_message;
  long lVar20;
  sbyte sVar21;
  int iVar22;
  long lVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  uint uVar28;
  uint uVar29;
  int iVar30;
  uint uVar31;
  ulong uVar32;
  int iVar33;
  uint uVar34;
  int iVar35;
  uint uVar36;
  bool bVar37;
  bool bVar38;
  double dVar39;
  uchar b [4];
  ulong local_130;
  undefined8 local_118;
  int local_10c;
  uint local_108;
  uint local_104;
  ulong local_100;
  int *local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  int *local_d8;
  uint *local_d0;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int *local_b8;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  char local_82 [2];
  int *local_80;
  int *local_78;
  ulong local_70;
  long local_68;
  int *local_60;
  long local_58;
  int *local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  ulong uVar27;
  
  if (0 < *status) {
    return *status;
  }
  local_82 = *(char (*) [2])input;
  nextchar = 2;
  if (local_82 == code_magic) {
    local_e0 = CONCAT44(local_e0._4_4_,smooth);
    uVar5 = *(uint *)(input + 2) & 0xff;
    lVar20 = 1;
    do {
      uVar5 = (uint)*(byte *)((long)&local_118 + lVar20) | uVar5 << 8;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    *nx = uVar5;
    uVar5 = *(uint *)(input + 6) & 0xff;
    lVar20 = 1;
    do {
      uVar5 = (uint)*(byte *)((long)&local_118 + lVar20) | uVar5 << 8;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    *ny = uVar5;
    uVar5 = *(uint *)(input + 10) & 0xff;
    lVar20 = 1;
    do {
      uVar5 = (uint)*(byte *)((long)&local_118 + lVar20) | uVar5 << 8;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    *scale = uVar5;
    local_118 = *(ulong *)(input + 0xe);
    uVar18 = local_118 & 0xff;
    lVar20 = 1;
    do {
      uVar5 = (uint)*(byte *)((long)&local_118 + lVar20) | (int)uVar18 << 8;
      uVar18 = (ulong)uVar5;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 8);
    bVar10 = input[0x16];
    bVar1 = input[0x17];
    bVar2 = input[0x18];
    nextchar = 0x19;
    iVar8 = *nx;
    iVar13 = *ny;
    uVar15 = iVar13 * iVar8;
    iVar6 = (iVar8 - (iVar8 + 1 >> 0x1f)) + 1 >> 1;
    iVar33 = (iVar13 - (iVar13 + 1 >> 0x1f)) + 1 >> 1;
    local_f8 = scale;
    local_d8 = nx;
    local_d0 = (uint *)ny;
    if (0 < (int)uVar15) {
      memset(a,0,(ulong)uVar15 << 2);
    }
    bits_to_go = 0;
    iVar7 = qtree_decode(input,a,iVar13,iVar6,iVar33,(uint)bVar10);
    if (iVar7 == 0) {
      iVar7 = qtree_decode(input,a + iVar33,iVar13,iVar6,iVar13 / 2,(uint)bVar1);
      if (iVar7 == 0) {
        iVar7 = qtree_decode(input,a + iVar6 * iVar13,iVar13,iVar8 / 2,iVar33,(uint)bVar1);
        if ((iVar7 == 0) &&
           (iVar7 = qtree_decode(input,a + (iVar6 * iVar13 + iVar33),iVar13,iVar8 / 2,iVar13 / 2,
                                 (uint)bVar2), iVar7 == 0)) {
          iVar8 = input_nybble(input);
          if (iVar8 == 0) {
            bits_to_go = 0;
            if (0 < (int)uVar15) {
              uVar18 = 0;
              uVar19 = 0;
              lVar20 = nextchar;
              uVar24 = buffer2;
              do {
                if (a[uVar18] != 0) {
                  if (uVar19 == 0) {
                    uVar24 = (uint)input[lVar20];
                    lVar20 = lVar20 + 1;
                    uVar19 = 7;
                    nextchar = lVar20;
                    buffer2 = uVar24;
                  }
                  else {
                    uVar19 = uVar19 - 1;
                  }
                  bits_to_go = uVar19;
                  if ((uVar24 >> (uVar19 & 0x1f) & 1) != 0) {
                    a[uVar18] = -a[uVar18];
                  }
                }
                uVar18 = uVar18 + 1;
              } while (uVar15 != uVar18);
            }
            *a = uVar5;
            *status = 0;
            iVar8 = *local_f8;
            iVar13 = *local_d8;
            uVar5 = *local_d0;
            local_100 = (ulong)uVar5;
            if ((1 < iVar8) && (piVar11 = a, a <= a + (long)(int)(iVar13 * uVar5) + -1)) {
              do {
                *piVar11 = *piVar11 * iVar8;
                piVar11 = piVar11 + 1;
              } while (piVar11 <= a + (long)(int)(iVar13 * uVar5) + -1);
              iVar13 = *local_d8;
              local_100 = (ulong)*local_d0;
              iVar8 = *local_f8;
            }
            iVar6 = (int)local_100;
            if ((int)local_100 < iVar13) {
              iVar6 = iVar13;
            }
            dVar39 = log((double)iVar6);
            local_80 = (int *)malloc((long)((iVar6 - (iVar6 + 1 >> 0x1f)) + 1 >> 1) << 2);
            if (local_80 != (int *)0x0) {
              iVar33 = (int)(dVar39 / 0.6931471805599453 + 0.5);
              sVar21 = 1;
              bVar4 = 1 << ((byte)iVar33 & 0x1f) < iVar6;
              iVar6 = (uint)bVar4 + iVar33;
              local_10c = iVar33 + (uint)bVar4 + -1;
              bVar10 = (byte)local_10c;
              uVar5 = 1 << (bVar10 & 0x1f);
              *a = (*a >> 0x1f) + *a + ((4 << (bVar10 & 0x1f)) >> 1) & uVar5 * -4;
              local_f8 = (int *)(ulong)-uVar5;
              if (0 < iVar6) {
                local_c8 = 1 << ((byte)iVar6 & 0x1f);
                uVar15 = 2 << (bVar10 & 0x1f);
                uVar24 = (int)uVar15 >> 1;
                uVar27 = (ulong)uVar24;
                local_d8 = (int *)CONCAT44(local_d8._4_4_,uVar24 - 1);
                bVar38 = (int)local_e0 != 0;
                local_108 = iVar8 >> 1;
                bVar4 = 0 < (int)local_108;
                iVar8 = (int)local_100;
                local_f0 = (ulong)(uint)(iVar8 * 2);
                local_104 = -local_108;
                local_a8 = iVar8 * 3;
                lVar20 = (long)(iVar8 * 2);
                local_ac = iVar8 * 3 + 2;
                local_68 = (long)iVar8 << 2;
                local_78 = a + lVar20;
                local_58 = lVar20 * -4;
                local_60 = a + (2 - lVar20);
                local_b0 = iVar8 * 2 + 2;
                local_b8 = a + 1;
                local_70 = local_100 & 0xffffffff;
                local_d0 = (uint *)CONCAT44(local_d0._4_4_,uVar5);
                local_130 = 1;
                uVar32 = local_100 & 0xffffffff;
                uVar18 = 1;
                local_e0 = (ulong)uVar5;
                uVar5 = uVar5 * -2;
                do {
                  lVar20 = local_68;
                  piVar11 = local_80;
                  local_9c = local_10c;
                  iVar8 = (int)local_d8;
                  uVar24 = (int)local_e0 >> 1;
                  local_e0 = (ulong)uVar24;
                  local_c8 = local_c8 >> 1;
                  local_a0 = local_c8;
                  if (iVar13 <= local_c8) {
                    local_a0 = 0;
                  }
                  uVar19 = (int)local_130 * 2 - (uint)(iVar13 <= local_c8);
                  local_130 = (ulong)uVar19;
                  local_98 = (int)uVar32;
                  local_a4 = local_c8;
                  if (local_98 <= local_c8) {
                    local_a4 = 0;
                  }
                  uVar28 = (int)uVar18 * 2 - (uint)(local_98 <= local_c8);
                  uVar18 = (ulong)uVar28;
                  bVar37 = local_10c == 0;
                  local_10c = local_10c + -1;
                  if (bVar37) {
                    sVar21 = 2;
                  }
                  iVar6 = uVar24 - 1;
                  if (bVar37) {
                    iVar6 = 0;
                  }
                  local_d8 = (int *)CONCAT44(local_d8._4_4_,iVar6);
                  piVar14 = a;
                  uVar32 = local_130;
                  local_94 = iVar13;
                  if (0 < (int)uVar19) {
                    do {
                      unshuffle(piVar14,uVar28,1,piVar11);
                      uVar32 = uVar32 - 1;
                      piVar14 = (int *)((long)piVar14 + lVar20);
                    } while (uVar32 != 0);
                  }
                  uVar32 = local_100;
                  piVar14 = a;
                  local_e8 = uVar18;
                  if (0 < (int)uVar28) {
                    do {
                      unshuffle(piVar14,uVar19,(int)uVar32,piVar11);
                      uVar18 = uVar18 - 1;
                      piVar14 = piVar14 + 1;
                    } while (uVar18 != 0);
                  }
                  iVar13 = (int)local_e8;
                  if (bVar4 && bVar38) {
                    local_bc = uVar19 - 2;
                    if (4 < (int)uVar19) {
                      iVar33 = 2;
                      uVar18 = local_f0 & 0xffffffff;
                      iVar6 = local_a8;
                      do {
                        if (0 < iVar13) {
                          lVar20 = (long)(int)uVar18;
                          lVar23 = 0;
                          do {
                            iVar7 = *(int *)((long)a + lVar23 * 4 + local_58 + lVar20 * 4);
                            uVar34 = local_78[lVar20 + lVar23] - a[lVar20 + lVar23];
                            uVar28 = a[lVar20 + lVar23] - iVar7;
                            uVar24 = uVar28;
                            if ((int)uVar34 < (int)uVar28) {
                              uVar24 = uVar34;
                            }
                            if ((int)uVar28 < (int)uVar34) {
                              uVar28 = uVar34;
                            }
                            if ((int)uVar24 < 1) {
                              uVar24 = 0;
                            }
                            iVar25 = uVar24 * 4;
                            iVar35 = ((int)uVar28 >> 0x1f & uVar28) * 4;
                            if (SBORROW4(iVar35,iVar25) != (int)(iVar35 + uVar24 * -4) < 0) {
                              iVar7 = local_78[lVar20 + lVar23] - iVar7;
                              if (SBORROW4(iVar7,iVar25) != (int)(iVar7 + uVar24 * -4) < 0) {
                                iVar25 = iVar7;
                              }
                              if (iVar7 <= iVar35) {
                                iVar25 = iVar35;
                              }
                              uVar28 = iVar25 + a[iVar6 + lVar23] * -8;
                              uVar24 = (int)(uVar28 + 7) >> 3;
                              if (-1 < (int)uVar28) {
                                uVar24 = uVar28 >> 3;
                              }
                              if ((int)local_108 <= (int)uVar24) {
                                uVar24 = local_108;
                              }
                              if ((int)uVar24 <= (int)local_104) {
                                uVar24 = local_104;
                              }
                              a[iVar6 + lVar23] = uVar24 + a[iVar6 + lVar23];
                            }
                            lVar23 = lVar23 + 2;
                          } while ((int)lVar23 < iVar13);
                        }
                        iVar33 = iVar33 + 2;
                        iVar6 = iVar6 + (int)local_f0;
                        uVar18 = (ulong)(uint)((int)uVar18 + (int)local_f0);
                      } while (iVar33 < local_bc);
                    }
                    if (0 < (int)uVar19) {
                      iVar6 = 0;
                      iVar33 = 2;
                      do {
                        if (4 < iVar13) {
                          piVar11 = a + iVar33;
                          lVar20 = 2;
                          iVar7 = *piVar11;
                          do {
                            iVar25 = piVar11[lVar20];
                            uVar34 = iVar25 - iVar7;
                            uVar28 = iVar7 - piVar11[lVar20 + -4];
                            uVar24 = uVar28;
                            if ((int)uVar34 < (int)uVar28) {
                              uVar24 = uVar34;
                            }
                            if ((int)uVar28 < (int)uVar34) {
                              uVar28 = uVar34;
                            }
                            if ((int)uVar24 < 1) {
                              uVar24 = 0;
                            }
                            iVar7 = uVar24 * 4;
                            iVar35 = ((int)uVar28 >> 0x1f & uVar28) * 4;
                            if (SBORROW4(iVar35,iVar7) != (int)(iVar35 + uVar24 * -4) < 0) {
                              iVar26 = iVar25 - piVar11[lVar20 + -4];
                              if (SBORROW4(iVar26,iVar7) != (int)(iVar26 + uVar24 * -4) < 0) {
                                iVar7 = iVar26;
                              }
                              if (iVar26 <= iVar35) {
                                iVar7 = iVar35;
                              }
                              uVar28 = iVar7 + piVar11[lVar20 + -1] * -8;
                              uVar24 = (int)(uVar28 + 7) >> 3;
                              if (-1 < (int)uVar28) {
                                uVar24 = uVar28 >> 3;
                              }
                              if ((int)local_108 <= (int)uVar24) {
                                uVar24 = local_108;
                              }
                              if ((int)uVar24 <= (int)local_104) {
                                uVar24 = local_104;
                              }
                              piVar11[lVar20 + -1] = uVar24 + piVar11[lVar20 + -1];
                            }
                            lVar20 = lVar20 + 2;
                            iVar7 = iVar25;
                          } while ((int)lVar20 < iVar13 + -2);
                        }
                        iVar6 = iVar6 + 2;
                        iVar33 = iVar33 + (int)local_f0;
                      } while (iVar6 < (int)uVar19);
                      if (4 < (int)uVar19) {
                        local_c0 = local_b0;
                        local_c4 = local_ac;
                        iVar6 = 2;
                        do {
                          local_90 = iVar6;
                          if (4 < iVar13) {
                            lVar20 = (long)local_c0;
                            local_38 = a + lVar20;
                            local_40 = local_78 + lVar20 + 2;
                            local_48 = local_60 + lVar20;
                            local_50 = local_b8 + local_c4;
                            lVar20 = 0;
                            do {
                              local_8c = local_48[lVar20];
                              local_88 = local_40[lVar20 + -4];
                              iVar7 = local_50[lVar20 + -1];
                              iVar25 = local_38[lVar20];
                              iVar35 = local_40[lVar20] - iVar25;
                              iVar26 = iVar25 - local_88;
                              iVar33 = local_48[lVar20 + -4] - iVar25;
                              iVar25 = iVar25 - local_8c;
                              iVar6 = 0;
                              if (0 < iVar33) {
                                iVar6 = iVar33;
                              }
                              if (-1 < iVar33) {
                                iVar33 = 0;
                              }
                              iVar30 = 0;
                              if (0 < iVar25) {
                                iVar30 = iVar25;
                              }
                              if (-1 < iVar25) {
                                iVar25 = 0;
                              }
                              iVar22 = 0;
                              if (0 < iVar26) {
                                iVar22 = iVar26;
                              }
                              if (-1 < iVar26) {
                                iVar26 = 0;
                              }
                              iVar12 = 0;
                              if (0 < iVar35) {
                                iVar12 = iVar35;
                              }
                              iVar3 = local_38[lVar20 + 1];
                              if (-1 < iVar35) {
                                iVar35 = 0;
                              }
                              iVar16 = iVar7 * 2 + iVar3 * 2;
                              iVar12 = iVar12 - iVar16;
                              iVar22 = iVar22 + iVar7 * 2 + iVar3 * -2;
                              if (iVar12 < iVar22) {
                                iVar22 = iVar12;
                              }
                              iVar6 = iVar6 + iVar7 * 2;
                              iVar30 = iVar30 + iVar7 * -2;
                              if (iVar6 <= iVar30) {
                                iVar30 = iVar6;
                              }
                              iVar30 = iVar30 + iVar3 * 2;
                              if (iVar30 <= iVar22) {
                                iVar22 = iVar30;
                              }
                              iVar35 = iVar35 - iVar16;
                              iVar6 = iVar26 + iVar7 * 2 + iVar3 * -2;
                              iVar26 = iVar22 * 0x10;
                              if (iVar6 < iVar35) {
                                iVar6 = iVar35;
                              }
                              iVar25 = iVar25 + iVar7 * -2;
                              iVar33 = iVar33 + iVar7 * 2;
                              if (iVar25 <= iVar33) {
                                iVar25 = iVar33;
                              }
                              iVar25 = iVar25 + iVar3 * 2;
                              if (iVar6 <= iVar25) {
                                iVar6 = iVar25;
                              }
                              iVar33 = iVar6 * 0x10;
                              if (SBORROW4(iVar33,iVar26) != iVar33 + iVar22 * -0x10 < 0) {
                                iVar7 = (local_48[lVar20 + -4] - (local_88 + local_8c)) +
                                        local_40[lVar20];
                                if (SBORROW4(iVar7,iVar26) != iVar7 + iVar22 * -0x10 < 0) {
                                  iVar26 = iVar7;
                                }
                                if (iVar7 == iVar33 ||
                                    SBORROW4(iVar7,iVar33) != iVar7 + iVar6 * -0x10 < 0) {
                                  iVar26 = iVar33;
                                }
                                uVar28 = iVar26 + local_50[lVar20] * -0x40;
                                uVar24 = (int)(uVar28 + 0x3f) >> 6;
                                if (-1 < (int)uVar28) {
                                  uVar24 = uVar28 >> 6;
                                }
                                if ((int)local_108 <= (int)uVar24) {
                                  uVar24 = local_108;
                                }
                                if ((int)uVar24 <= (int)local_104) {
                                  uVar24 = local_104;
                                }
                                local_50[lVar20] = uVar24 + local_50[lVar20];
                              }
                              iVar6 = (int)lVar20;
                              lVar20 = lVar20 + 2;
                            } while (iVar6 + 4 < iVar13 + -2);
                          }
                          local_c4 = local_c4 + (int)local_f0;
                          local_c0 = local_c0 + (int)local_f0;
                          iVar6 = local_90 + 2;
                        } while (local_90 + 2 < local_bc);
                      }
                    }
                  }
                  uVar28 = uVar19 - ((int)uVar19 >> 0x1f) & 0xfffffffe;
                  iVar6 = iVar13 - (((uint)(local_e8 >> 0x1f) & 1) + iVar13 & 0xfffffffe);
                  uVar24 = (uint)local_d0;
                  iVar33 = (int)uVar27;
                  if ((int)uVar28 < 1) {
                    iVar7 = 0;
                  }
                  else {
                    lVar20 = 0;
                    iVar7 = 0;
                    uVar18 = local_70;
                    do {
                      if (iVar13 - iVar6 < 1) {
                        iVar35 = iVar7 * (int)local_100;
                        iVar25 = iVar35 + (int)local_100;
                      }
                      else {
                        iVar25 = (int)uVar18;
                        iVar26 = (int)lVar20;
                        lVar23 = 0;
                        do {
                          iVar35 = iVar33;
                          if (local_b8[(long)iVar25 + lVar23 + -1] < 0) {
                            iVar35 = iVar8;
                          }
                          uVar34 = iVar35 + local_b8[(long)iVar25 + lVar23 + -1] & uVar5;
                          iVar35 = iVar33;
                          if (local_b8[iVar26 + lVar23] < 0) {
                            iVar35 = iVar8;
                          }
                          uVar31 = iVar35 + local_b8[iVar26 + lVar23] & uVar5;
                          iVar35 = (int)local_e0;
                          if (local_b8[iVar25 + lVar23] < 0) {
                            iVar35 = (int)local_d8;
                          }
                          uVar9 = iVar35 + local_b8[iVar25 + lVar23] & (uint)local_f8;
                          uVar29 = uVar9 & (uint)local_d0;
                          uVar36 = -uVar29;
                          if ((int)uVar34 < 0) {
                            uVar36 = uVar29;
                          }
                          uVar36 = uVar36 + uVar34;
                          iVar35 = local_b8[(long)iVar26 + lVar23 + -1];
                          uVar34 = -uVar29;
                          if ((int)uVar31 < 0) {
                            uVar34 = uVar29;
                          }
                          uVar34 = uVar34 + uVar31;
                          uVar31 = (uVar36 ^ uVar9 ^ uVar34) & uVar15;
                          if (iVar35 < 0) {
                            uVar17 = uVar29 - uVar31;
                            if (uVar29 == 0) {
                              uVar17 = uVar31;
                            }
                            iVar35 = uVar17 + iVar35;
                          }
                          else {
                            iVar35 = (uVar29 + iVar35) - uVar31;
                          }
                          local_b8[iVar25 + lVar23] =
                               (int)(iVar35 + uVar36 + uVar34 + uVar9) >> sVar21;
                          local_b8[(long)iVar25 + lVar23 + -1] =
                               (int)((iVar35 + uVar36) - (uVar34 + uVar9)) >> sVar21;
                          local_b8[iVar26 + lVar23] =
                               (int)((uVar34 - uVar9) + (iVar35 - uVar36)) >> sVar21;
                          local_b8[(long)iVar26 + lVar23 + -1] =
                               (int)((uVar9 - uVar34) + (iVar35 - uVar36)) >> sVar21;
                          lVar23 = lVar23 + 2;
                          iVar35 = (int)lVar23;
                        } while (iVar35 < iVar13 - iVar6);
                        iVar25 = iVar25 + iVar35;
                        iVar35 = iVar35 + iVar26;
                      }
                      if (iVar6 != 0) {
                        iVar26 = iVar33;
                        if (a[iVar25] < 0) {
                          iVar26 = iVar8;
                        }
                        uVar31 = iVar26 + a[iVar25] & uVar5;
                        uVar34 = -(uVar31 & uVar15);
                        if (a[iVar35] < 0) {
                          uVar34 = uVar31 & uVar15;
                        }
                        iVar26 = uVar34 + a[iVar35];
                        a[iVar25] = (int)(iVar26 + uVar31) >> sVar21;
                        a[iVar35] = (int)(iVar26 - uVar31) >> sVar21;
                      }
                      iVar7 = iVar7 + 2;
                      lVar20 = lVar20 + local_f0;
                      uVar18 = uVar18 + local_f0;
                    } while (iVar7 < (int)uVar28);
                  }
                  if (uVar19 != uVar28) {
                    iVar7 = iVar7 * (int)local_100;
                    if (iVar6 < iVar13) {
                      lVar20 = 0;
                      do {
                        iVar25 = iVar33;
                        if (local_b8[iVar7 + lVar20] < 0) {
                          iVar25 = iVar8;
                        }
                        uVar28 = iVar25 + local_b8[iVar7 + lVar20] & uVar5;
                        uVar19 = -(uVar28 & uVar15);
                        if (local_b8[(long)iVar7 + lVar20 + -1] < 0) {
                          uVar19 = uVar28 & uVar15;
                        }
                        iVar25 = uVar19 + local_b8[(long)iVar7 + lVar20 + -1];
                        local_b8[iVar7 + lVar20] = (int)(iVar25 + uVar28) >> sVar21;
                        local_b8[(long)iVar7 + lVar20 + -1] = (int)(iVar25 - uVar28) >> sVar21;
                        lVar20 = lVar20 + 2;
                      } while ((int)lVar20 < iVar13 - iVar6);
                      iVar7 = iVar7 + (int)lVar20;
                    }
                    if (iVar6 != 0) {
                      a[iVar7] = a[iVar7] >> sVar21;
                    }
                  }
                  iVar13 = local_94 - local_a0;
                  uVar32 = (ulong)(uint)(local_98 - local_a4);
                  uVar19 = (int)(uint)local_f8 >> 1;
                  uVar27 = local_e0 & 0xffffffff;
                  local_d0 = (uint *)CONCAT44(local_d0._4_4_,(int)(uint)local_d0 >> 1);
                  uVar18 = local_e8;
                  uVar15 = uVar24;
                  uVar5 = (uint)local_f8;
                  local_f8 = (int *)(ulong)uVar19;
                } while (0 < local_9c);
              }
              free(local_80);
              iVar7 = 0;
              goto LAB_001bf29e;
            }
            err_message = "hinv: insufficient memory";
            local_80 = (int *)0x0;
            goto LAB_001bf0d9;
          }
          ffpmsg("dodecode: bad bit plane values");
          iVar7 = 0x19e;
        }
      }
    }
    *a = uVar5;
  }
  else {
    err_message = "bad file format";
LAB_001bf0d9:
    ffpmsg(err_message);
    iVar7 = 0x19e;
  }
LAB_001bf29e:
  *status = iVar7;
  return iVar7;
}

Assistant:

int fits_hdecompress(unsigned char *input, int smooth, int *a, int *ny, int *nx, 
                     int *scale, int *status)
{
  /* 
     decompress the input byte stream using the H-compress algorithm
  
   input  - input array of compressed bytes
   a - pre-allocated array to hold the output uncompressed image
   nx - returned X axis size
   ny - returned Y axis size

 NOTE: the nx and ny dimensions as defined within this code are reversed from
 the usual FITS notation.  ny is the fastest varying dimension, which is
 usually considered the X axis in the FITS image display

  */
int stat;

  if (*status > 0) return(*status);

	/* decode the input array */

        FFLOCK;  /* decode uses the nextchar global variable */
	stat = decode(input, a, nx, ny, scale);
        FFUNLOCK;

        *status = stat;
	if (stat) return(*status);
	
	/*
	 * Un-Digitize
	 */
	undigitize(a, *nx, *ny, *scale);

	/*
	 * Inverse H-transform
	 */
	stat = hinv(a, *nx, *ny, smooth, *scale);
        *status = stat;
	
  return(*status);
}